

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scolumn_bmod.c
# Opt level: O3

int scolumn_bmod(int jcol,int nseg,float *dense,float *tempv,int *segrep,int *repfnz,int fpanelc,
                GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  long lVar1;
  int iVar2;
  int_t *piVar3;
  uint uVar4;
  int_t iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  float *pfVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint nrow;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  int_t nzlumax;
  void *local_d0;
  int_t *local_c0;
  int_t local_9c;
  int_t *local_98;
  ulong local_90;
  float *local_88;
  int_t local_7c;
  long local_78;
  long local_70;
  flops_t *local_68;
  int *local_60;
  long local_58;
  long local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_68 = stat->ops;
  local_60 = Glu->xsup;
  local_40 = Glu->supno;
  local_c0 = Glu->lsub;
  local_98 = Glu->xlsub;
  local_d0 = Glu->lusup;
  piVar3 = Glu->xlusup;
  local_9c = Glu->nzlumax;
  local_70 = (long)jcol;
  local_58 = (long)local_40[local_70];
  local_7c = local_9c;
  local_48 = repfnz;
  local_38 = segrep;
  if (0 < nseg) {
    uVar9 = (ulong)(uint)nseg;
    local_78 = (long)local_d0 + 4;
    uVar12 = 0;
    do {
      iVar6 = local_38[uVar9 - 1];
      local_90 = uVar12;
      local_88 = (float *)uVar9;
      if ((int)local_58 != local_40[iVar6]) {
        iVar8 = local_60[local_40[iVar6]];
        iVar15 = fpanelc;
        if (fpanelc < iVar8) {
          iVar15 = iVar8;
        }
        iVar18 = iVar15 - iVar8;
        iVar20 = piVar3[iVar15] + iVar18;
        iVar14 = local_98[iVar8] + iVar18;
        iVar13 = local_48[iVar6];
        if (local_48[iVar6] <= fpanelc) {
          iVar13 = fpanelc;
        }
        uVar4 = (iVar6 - iVar13) + 1;
        uVar16 = iVar6 - iVar15;
        iVar2 = local_98[(long)iVar8 + 1];
        lVar7 = (long)iVar2;
        iVar8 = iVar2 - local_98[iVar8];
        nrow = (~uVar16 - iVar18) + iVar8;
        iVar19 = uVar16 + iVar14;
        local_68[0x13] = (float)(int)((iVar6 - iVar13) * uVar4) + local_68[0x13];
        iVar18 = uVar16 + iVar14 + 1;
        local_68[0x14] = (float)(int)(nrow * uVar4 * 2) + local_68[0x14];
        if (iVar6 == iVar13) {
          if (iVar18 < iVar2) {
            fVar23 = dense[local_c0[iVar19]];
            lVar10 = (long)iVar18;
            pfVar11 = (float *)((long)local_d0 +
                               (long)(int)(iVar8 * uVar16 + iVar20 + uVar16 + 1) * 4);
            do {
              dense[local_c0[lVar10]] = *pfVar11 * -fVar23 + dense[local_c0[lVar10]];
              lVar10 = lVar10 + 1;
              pfVar11 = pfVar11 + 1;
            } while (lVar10 < lVar7);
          }
        }
        else if (iVar6 - iVar13 < 3) {
          iVar6 = local_c0[iVar19];
          iVar20 = (iVar8 + 1) * uVar16 + iVar20;
          iVar15 = local_c0[(long)iVar19 + -1];
          fVar23 = dense[iVar15];
          lVar10 = (long)(iVar20 - iVar8);
          if (uVar4 == 2) {
            fVar21 = dense[iVar6] - *(float *)((long)local_d0 + lVar10 * 4) * fVar23;
            dense[iVar6] = fVar21;
            if (iVar18 < iVar2) {
              lVar17 = 0;
              do {
                dense[local_c0[iVar18 + lVar17]] =
                     dense[local_c0[iVar18 + lVar17]] -
                     (*(float *)(local_78 + (long)iVar20 * 4 + lVar17 * 4) * fVar21 +
                     *(float *)(local_78 + lVar10 * 4 + lVar17 * 4) * fVar23);
                lVar1 = iVar18 + lVar17;
                lVar17 = lVar17 + 1;
              } while (lVar1 + 1 < lVar7);
            }
          }
          else {
            fVar21 = dense[local_c0[(long)iVar19 + -2]];
            lVar17 = (long)((iVar20 - iVar8) - iVar8);
            fVar23 = fVar23 - *(float *)((long)local_d0 + lVar17 * 4 + -4) * fVar21;
            fVar22 = (dense[iVar6] - *(float *)((long)local_d0 + lVar10 * 4) * fVar23) -
                     *(float *)((long)local_d0 + lVar17 * 4) * fVar21;
            dense[iVar6] = fVar22;
            dense[iVar15] = fVar23;
            if (iVar18 < iVar2) {
              lVar17 = 0;
              do {
                dense[local_c0[iVar18 + lVar17]] =
                     dense[local_c0[iVar18 + lVar17]] -
                     (*(float *)(lVar10 * 4 + (long)iVar8 * -4 + local_78 + lVar17 * 4) * fVar21 +
                     *(float *)(local_78 + (long)iVar20 * 4 + lVar17 * 4) * fVar22 +
                     *(float *)(local_78 + lVar10 * 4 + lVar17 * 4) * fVar23);
                lVar1 = iVar18 + lVar17;
                lVar17 = lVar17 + 1;
              } while (lVar1 + 1 < lVar7);
            }
          }
        }
        else {
          iVar14 = iVar14 + (iVar13 - iVar15);
          uVar9 = (ulong)((iVar6 - iVar13) + 1);
          uVar12 = 0;
          do {
            tempv[uVar12] = dense[local_c0[(long)iVar14 + uVar12]];
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
          local_50 = (long)((iVar8 + 1) * (iVar13 - iVar15) + iVar20);
          slsolve(iVar8,uVar4,(float *)((long)local_d0 + local_50 * 4),tempv);
          pfVar11 = tempv + uVar4;
          smatvec(iVar8,nrow,uVar4,
                  (float *)((long)local_d0 + (long)(int)((int)local_50 + uVar4) * 4),tempv,pfVar11);
          uVar12 = 0;
          iVar6 = iVar14;
          do {
            dense[local_c0[(long)iVar14 + uVar12]] = tempv[uVar12];
            tempv[uVar12] = 0.0;
            uVar12 = uVar12 + 1;
            iVar6 = iVar6 + 1;
          } while (uVar9 != uVar12);
          if (0 < (int)nrow) {
            uVar12 = 0;
            do {
              dense[local_c0[(long)iVar6 + uVar12]] =
                   dense[local_c0[(long)iVar6 + uVar12]] - pfVar11[uVar12];
              pfVar11[uVar12] = 0.0;
              uVar12 = uVar12 + 1;
            } while (uVar12 < nrow);
          }
        }
      }
      uVar9 = (long)local_88 - 1;
      uVar4 = (int)local_90 + 1;
      uVar12 = (ulong)uVar4;
    } while (uVar4 != nseg);
  }
  iVar6 = piVar3[local_70];
  iVar8 = local_60[local_58];
  iVar15 = local_98[iVar8];
  iVar14 = local_98[(long)iVar8 + 1];
  iVar13 = (iVar14 + iVar6) - iVar15;
  if (local_7c < iVar13) {
    do {
      iVar5 = sLUMemXpand(jcol,iVar6,LUSUP,&local_9c,Glu);
      if (iVar5 != 0) {
        return iVar5;
      }
    } while (local_9c < iVar13);
    local_c0 = Glu->lsub;
    local_d0 = Glu->lusup;
    iVar15 = local_98[iVar8];
    iVar14 = local_98[(long)iVar8 + 1];
  }
  if (iVar15 < iVar14) {
    lVar7 = 0;
    do {
      iVar13 = local_c0[iVar15 + lVar7];
      *(float *)((long)local_d0 + lVar7 * 4 + (long)iVar6 * 4) = dense[iVar13];
      dense[iVar13] = 0.0;
      lVar7 = lVar7 + 1;
    } while ((long)iVar14 - (long)iVar15 != lVar7);
    iVar6 = (int)lVar7 + iVar6;
  }
  if (fpanelc < iVar8) {
    fpanelc = iVar8;
  }
  piVar3[local_70 + 1] = iVar6;
  iVar6 = jcol - fpanelc;
  if (iVar6 != 0 && fpanelc <= jcol) {
    iVar15 = piVar3[fpanelc];
    iVar13 = local_98[(long)iVar8 + 1] - local_98[iVar8];
    uVar4 = (iVar8 - jcol) + iVar13;
    iVar14 = piVar3[local_70];
    local_68[0x13] = (float)((iVar6 + -1) * iVar6) + local_68[0x13];
    local_90 = (long)iVar15 + (long)(fpanelc - iVar8);
    lVar7 = (long)iVar14 + (long)(fpanelc - iVar8);
    local_68[0x14] = (float)(int)(iVar6 * uVar4 * 2) + local_68[0x14];
    local_88 = (float *)((long)local_d0 + lVar7 * 4);
    slsolve(iVar13,iVar6,(float *)((long)local_d0 + local_90 * 4),local_88);
    smatvec(iVar13,uVar4,iVar6,(float *)((long)local_d0 + (long)((int)local_90 + iVar6) * 4),
            local_88,tempv);
    if (0 < (int)uVar4) {
      iVar6 = (int)lVar7 + iVar6;
      uVar12 = 0;
      do {
        *(float *)((long)local_d0 + uVar12 * 4 + (long)iVar6 * 4) =
             *(float *)((long)local_d0 + uVar12 * 4 + (long)iVar6 * 4) - tempv[uVar12];
        tempv[uVar12] = 0.0;
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar4);
    }
  }
  return 0;
}

Assistant:

int
scolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     float     *dense,	  /* in */
	     float     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    float      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    float      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    float       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    float       *tempv1;
    float      zero = 0.0;
    float      one = 1.0;
    float      none = -1.0;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (float *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += segsze * (segsze - 1);
	    ops[GEMV] += 2 * nrow * segsze;


	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    dense[irow] -=  ukj*lusup[luptr];
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    ukj -= ukj1 * lusup[luptr1];
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
		    	dense[irow] -= ( ukj*lusup[luptr]
					+ ukj1*lusup[luptr1] );
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
		    ukj1 -= ukj2 * lusup[luptr2-1];
		    ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
		    	dense[irow] -= ( ukj*lusup[luptr]
			     + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
		    }
		}



	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		strsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		SGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		sgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		slsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		smatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    dense[irow] -= tempv1[i];
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = sLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (float *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += nsupc * (nsupc - 1);
	ops[GEMV] += 2 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	strsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	SGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	sgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	slsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	smatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    lusup[isub] -= tempv[i];
	    tempv[i] = 0.0;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}